

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

void __thiscall
deqp::gls::StateChangePerformanceCase::requireTextures(StateChangePerformanceCase *this,int count)

{
  int iVar1;
  StateChangePerformanceCase *pSVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  GLuint texture;
  int local_60;
  int local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  StateChangePerformanceCase *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> textureData;
  long lVar5;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  if ((int)((ulong)((long)(this->m_textures).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_textures).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < count) {
    local_58 = &this->m_textures;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(local_58,(long)count);
    textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&textureData,0x4000);
    iVar6 = 0;
    iVar3 = 0;
    local_60 = count;
    local_50 = this;
    while (pSVar2 = local_50, iVar1 = local_60, iVar3 != 0x40) {
      uVar7 = 0;
      local_5c = iVar3;
      for (uVar8 = 0; uVar8 != 0x3fc0; uVar8 = uVar8 + 0xff) {
        texture = CONCAT31(texture._1_3_,(char)((uint)(iVar3 * 0xff) >> 6));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&textureData,(uchar *)&texture);
        texture = CONCAT31(texture._1_3_,(char)(uVar8 >> 6));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&textureData,(uchar *)&texture);
        texture = CONCAT31(texture._1_3_,(char)(uVar7 >> 0xc));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&textureData,(uchar *)&texture);
        texture = CONCAT31(texture._1_3_,0xff);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&textureData,(uchar *)&texture);
        uVar7 = (ulong)(uint)((int)uVar7 + iVar6);
      }
      iVar6 = iVar6 + 0xff;
      iVar3 = local_5c + 1;
    }
    while ((int)((ulong)((long)(pSVar2->m_textures).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pSVar2->m_textures).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2) < iVar1) {
      (**(code **)(lVar5 + 0x6f8))(1,&texture);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGenTextures()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x161);
      (**(code **)(lVar5 + 0xb8))(0xde1,texture);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindTexture()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x164);
      (**(code **)(lVar5 + 0x1310))
                (0xde1,0,0x1908,0x40,0x40,0,0x1908,0x1401,
                 textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glTexImage2D()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x167);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glTexParameteri()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x16a);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glTexParameteri()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x16c);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x2901);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glTexParameteri()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x16e);
      (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x2901);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glTexParameteri()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x170);
      (**(code **)(lVar5 + 0xb8))(0xde1,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindTexture()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x173);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_58,&texture);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&textureData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireTextures (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	const int textureWidth	= 64;
	const int textureHeight	= 64;

	if ((int)m_textures.size() >= count)
		return;

	m_textures.reserve(count);

	vector<deUint8> textureData;
	genTextureData(textureData, textureWidth, textureHeight);

	DE_ASSERT(textureData.size() == textureWidth * textureHeight * 4);

	while ((int)m_textures.size() < count)
	{
		GLuint texture;

		gl.genTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures()");

		gl.bindTexture(GL_TEXTURE_2D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");

		gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, textureWidth, textureHeight, 0, GL_RGBA, GL_UNSIGNED_BYTE, &(textureData[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D()");

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri()");
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri()");
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri()");
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri()");

		gl.bindTexture(GL_TEXTURE_2D, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture()");

		m_textures.push_back(texture);
	}
}